

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x2x.cc
# Opt level: O1

bool __thiscall
anon_unknown.dwarf_21a7::DataTransform<long_double,_signed_char>::Run
          (DataTransform<long_double,_signed_char> *this,istream *input_stream)

{
  char cVar1;
  NumericType NVar2;
  WarningType WVar3;
  char *__nptr;
  bool bVar4;
  int *piVar5;
  undefined8 uVar6;
  ostream *poVar7;
  size_t sVar8;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  int iVar12;
  longdouble in_ST0;
  longdouble lVar13;
  longdouble lVar14;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  longdouble in_ST6;
  longdouble in_ST7;
  string word;
  char buffer [128];
  char local_28a;
  char local_288;
  char local_282;
  string local_280;
  string *local_260;
  long local_258;
  ulong local_250;
  longdouble local_248;
  char *local_230;
  long local_228;
  char local_220 [96];
  ios_base local_1c0 [264];
  char local_b8 [136];
  
  local_260 = &this->print_format_;
  iVar12 = 0;
  do {
    if (this->is_ascii_input_ == true) {
      local_230 = local_220;
      local_228 = 0;
      local_220[0] = '\0';
      std::operator>>(input_stream,(string *)&local_230);
      __nptr = local_230;
      if (local_228 == 0) {
        iVar9 = 2;
        bVar4 = false;
        lVar13 = in_ST0;
      }
      else {
        piVar5 = __errno_location();
        iVar9 = *piVar5;
        *piVar5 = 0;
        strtold(__nptr,(char **)&local_280);
        if (local_280._M_dataplus._M_p == __nptr) {
          uVar6 = std::__throw_invalid_argument("stold");
LAB_0014504a:
          if (local_230 != local_220) {
            operator_delete(local_230);
          }
          _Unwind_Resume(uVar6);
        }
        if (*piVar5 == 0) {
          *piVar5 = iVar9;
        }
        else if (*piVar5 == 0x22) {
          uVar6 = std::__throw_out_of_range("stold");
          goto LAB_0014504a;
        }
        iVar9 = 0;
        bVar4 = true;
        lVar13 = in_ST1;
        in_ST1 = in_ST2;
        in_ST2 = in_ST3;
        in_ST3 = in_ST4;
        in_ST4 = in_ST5;
        in_ST5 = in_ST6;
        in_ST6 = in_ST7;
        local_248 = in_ST0;
      }
      in_ST0 = lVar13;
      if (local_230 != local_220) {
        operator_delete(local_230);
        in_ST0 = lVar13;
      }
      if (bVar4) {
LAB_00144c97:
        local_282 = (char)(short)ROUND(local_248);
        local_28a = this->minimum_value_;
        cVar1 = this->maximum_value_;
        if (local_28a < cVar1) {
          NVar2 = this->input_numeric_type_;
          if (NVar2 == kFloatingPoint) {
            bVar4 = true;
            in_ST6 = in_ST5;
            if (((longdouble)(short)local_28a <= local_248) &&
               (local_28a = cVar1, local_248 <= (longdouble)(short)cVar1)) goto LAB_00144dbb;
          }
          else {
            uVar10 = (ulong)cVar1;
            if (NVar2 == kUnsignedInteger) {
              lVar14 = (longdouble)9.223372e+18;
              lVar13 = (longdouble)0;
              if (lVar14 <= local_248) {
                lVar13 = lVar14;
              }
              local_250 = (ulong)ROUND(local_248 - lVar13);
              uVar11 = (ulong)(lVar14 <= local_248) << 0x3f ^ local_250;
              bVar4 = true;
              in_ST5 = in_ST4;
              in_ST6 = in_ST4;
              if (((ulong)(long)local_28a <= uVar11) &&
                 (bVar4 = uVar10 < uVar11, local_28a = local_282, bVar4)) {
                local_28a = cVar1;
              }
            }
            else {
              if (NVar2 != kSignedInteger) goto LAB_00144dbb;
              local_258 = (long)ROUND(local_248);
              bVar4 = true;
              in_ST6 = in_ST5;
              if ((local_28a <= local_258) &&
                 (bVar4 = (long)uVar10 < local_258, local_28a = local_282, (long)uVar10 < local_258)
                 ) {
                local_28a = cVar1;
              }
            }
          }
        }
        else {
LAB_00144dbb:
          bVar4 = false;
          local_28a = local_282;
        }
        if ((!bVar4) && (this->rounding_ != false)) {
          in_ST6 = in_ST5;
          if (local_248 <= (longdouble)0) {
            local_288 = (char)(short)ROUND(local_248 + (longdouble)-0.5);
            local_28a = local_288;
          }
          else {
            local_28a = (char)(short)ROUND(local_248 + (longdouble)0.5);
          }
        }
        in_ST7 = in_ST6;
        if ((bool)(bVar4 & this->warning_type_ != kIgnore)) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_230);
          poVar7 = (ostream *)std::ostream::operator<<((ostream *)&local_230,iVar12);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar7,"th data is over the range of output type",0x28);
          local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_280,"x2x","");
          sptk::PrintErrorMessage(&local_280,(ostringstream *)&local_230);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_280._M_dataplus._M_p != &local_280.field_2) {
            operator_delete(local_280._M_dataplus._M_p);
          }
          WVar3 = this->warning_type_;
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_230);
          std::ios_base::~ios_base(local_1c0);
          iVar9 = 1;
          if (WVar3 == kExit) goto LAB_00144f9d;
        }
        if (this->is_ascii_output_ == true) {
          bVar4 = sptk::SnPrintf<signed_char>(local_28a,local_260,0x80,local_b8);
          iVar9 = 1;
          if (bVar4) {
            sVar8 = strlen(local_b8);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,local_b8,sVar8)
            ;
            if ((iVar12 + 1) % this->num_column_ == 0) {
              std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
              std::ostream::put(-0x78);
              std::ostream::flush();
            }
            else {
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\t",1);
            }
LAB_00144f9b:
            iVar9 = 0;
          }
        }
        else {
          bVar4 = sptk::WriteStream<signed_char>(local_28a,(ostream *)&std::cout);
          iVar9 = 1;
          if (bVar4) goto LAB_00144f9b;
        }
      }
    }
    else {
      bVar4 = sptk::ReadStream<long_double>(&local_248,input_stream);
      iVar9 = 2;
      if (bVar4) goto LAB_00144c97;
    }
LAB_00144f9d:
    if (iVar9 != 0) {
      if (iVar9 == 2) {
        bVar4 = true;
        if ((this->is_ascii_output_ == true) && (iVar12 % this->num_column_ != 0)) {
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
          std::ostream::put(-0x78);
          std::ostream::flush();
        }
      }
      else {
        bVar4 = false;
      }
      return bVar4;
    }
    iVar12 = iVar12 + 1;
  } while( true );
}

Assistant:

bool Run(std::istream* input_stream) const override {
    char buffer[kBufferSize];
    int index(0);
    for (;; ++index) {
      // Read.
      T1 input_data;
      if (is_ascii_input_) {
        std::string word;
        *input_stream >> word;
        if (word.empty()) break;
        try {
          input_data = static_cast<T1>(std::stold(word));
        } catch (std::invalid_argument&) {
          return false;
        }
      } else {
        if (!sptk::ReadStream(&input_data, input_stream)) {
          break;
        }
      }

      // Convert.
      T2 output_data(static_cast<T2>(input_data));

      bool is_clipped(false);
      {
        // Clipping.
        if (minimum_value_ < maximum_value_) {
          if (kSignedInteger == input_numeric_type_) {
            if (static_cast<std::int64_t>(input_data) <
                static_cast<std::int64_t>(minimum_value_)) {
              output_data = minimum_value_;
              is_clipped = true;
            } else if (static_cast<std::int64_t>(maximum_value_) <
                       static_cast<std::int64_t>(input_data)) {
              output_data = maximum_value_;
              is_clipped = true;
            }
          } else if (kUnsignedInteger == input_numeric_type_) {
            if (static_cast<std::uint64_t>(input_data) <
                static_cast<std::uint64_t>(minimum_value_)) {
              output_data = minimum_value_;
              is_clipped = true;
            } else if (static_cast<std::uint64_t>(maximum_value_) <
                       static_cast<std::uint64_t>(input_data)) {
              output_data = maximum_value_;
              is_clipped = true;
            }
          } else if (kFloatingPoint == input_numeric_type_) {
            if (static_cast<long double>(input_data) <
                static_cast<long double>(minimum_value_)) {
              output_data = minimum_value_;
              is_clipped = true;
            } else if (static_cast<long double>(maximum_value_) <
                       static_cast<long double>(input_data)) {
              output_data = maximum_value_;
              is_clipped = true;
            }
          }
        }

        // Rounding.
        if (rounding_ && !is_clipped) {
          if (0.0 < input_data) {
            output_data = static_cast<T2>(input_data + 0.5);
          } else {
            output_data = static_cast<T2>(input_data - 0.5);
          }
        }
      }

      if (is_clipped && kIgnore != warning_type_) {
        std::ostringstream error_message;
        error_message << index << "th data is over the range of output type";
        sptk::PrintErrorMessage("x2x", error_message);
        if (kExit == warning_type_) return false;
      }

      // Write output.
      if (is_ascii_output_) {
        if (!sptk::SnPrintf(output_data, print_format_, sizeof(buffer),
                            buffer)) {
          return false;
        }
        std::cout << buffer;
        if (0 == (index + 1) % num_column_) {
          std::cout << std::endl;
        } else {
          std::cout << "\t";
        }
      } else {
        if (!sptk::WriteStream(output_data, &std::cout)) {
          return false;
        }
      }
    }

    if (is_ascii_output_ && 0 != index % num_column_) {
      std::cout << std::endl;
    }

    return true;
  }